

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::TextureBarrierBasicOutline::iterate(TextureBarrierBasicOutline *this)

{
  long *plVar1;
  int *piVar2;
  TestLog *log;
  RenderContext *renderCtx;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 extraout_var;
  ShaderProgram *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TestError *pTVar7;
  int testPass;
  uint uVar8;
  GLuint i;
  uint uVar9;
  long lVar10;
  SharedPtr<glu::ShaderProgram> program;
  ProgramSources sources;
  allocator<char> local_15a;
  allocator<char> local_159;
  ShaderProgram *local_158;
  long *plStack_150;
  value_type local_140;
  value_type local_120;
  ProgramSources local_100;
  long lVar6;
  
  log = ((this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx
        )->m_log;
  iVar4 = (*((this->super_TextureBarrierBaseTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TextureBarrierBaseTest).super_TestCase.m_context)->m_renderCtx;
  iVar4 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[5])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,(char *)CONCAT44(extraout_var_00,iVar4),&local_159);
  iVar4 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[6])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,(char *)CONCAT44(extraout_var_01,iVar4),&local_15a);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&local_100,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources,&local_120);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + 1,&local_140);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_100);
  plStack_150 = (long *)0x0;
  local_158 = this_00;
  plStack_150 = (long *)operator_new(0x20);
  *(undefined4 *)(plStack_150 + 1) = 0;
  *(undefined4 *)((long)plStack_150 + 0xc) = 0;
  *plStack_150 = (long)&PTR__SharedPtrState_02131da8;
  plStack_150[2] = (long)this_00;
  *(undefined4 *)(plStack_150 + 1) = 1;
  *(undefined4 *)((long)plStack_150 + 0xc) = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar10 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar10));
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  glu::operator<<(log,local_158);
  if ((local_158->m_program).m_info.linkOk == false) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Program compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureBarrierTests.cpp"
               ,0x1a0);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  *(deUint32 *)&(this->super_TextureBarrierBaseTest).field_0x7c = (local_158->m_program).m_program;
  (**(code **)(lVar6 + 0x1680))();
  iVar4 = 0;
  do {
    local_100.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x7475706e49786574;
    local_100.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
         CONCAT22(0x5d,CONCAT11((char)iVar4 + '0',0x5b));
    uVar5 = (**(code **)(lVar6 + 0xb48))
                      (*(undefined4 *)&(this->super_TextureBarrierBaseTest).field_0x7c,&local_100);
    (**(code **)(lVar6 + 0x14f0))(uVar5);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 8);
  uVar8 = 0;
  do {
    iVar4 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[8])(this);
    if (iVar4 <= (int)uVar8) {
      (**(code **)(lVar6 + 0x1680))(0);
      tcu::TestContext::setTestResult
                ((this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      if (plStack_150 != (long *)0x0) {
        LOCK();
        plVar1 = plStack_150 + 1;
        *(int *)plVar1 = (int)*plVar1 + -1;
        UNLOCK();
        if ((int)*plVar1 == 0) {
          local_158 = (ShaderProgram *)0x0;
          (**(code **)(*plStack_150 + 0x10))();
        }
        LOCK();
        piVar2 = (int *)((long)plStack_150 + 0xc);
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if ((*piVar2 == 0) && (plStack_150 != (long *)0x0)) {
          (**(code **)(*plStack_150 + 8))();
        }
      }
      return STOP;
    }
    initTextureData(this);
    for (uVar9 = 0;
        iVar4 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode[9])(this), (int)uVar9 < iVar4; uVar9 = uVar9 + 1) {
      (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[10])(this,(ulong)uVar8,(ulong)uVar9);
      render(this);
      iVar4 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
                _vptr_TestNode[0xb])(this);
      if ((char)iVar4 != '\0') {
        (**(code **)(lVar6 + 0x13d0))();
      }
    }
    for (uVar9 = 0;
        iVar4 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode[9])(this), (int)uVar9 < iVar4; uVar9 = uVar9 + 1) {
      (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[10])(this,(ulong)uVar8,(ulong)uVar9);
      (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[7])(this);
    }
    bVar3 = verifyTextureData(this);
    uVar8 = uVar8 + 1;
  } while (bVar3);
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar7,"Failed to validate rendering results",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureBarrierTests.cpp"
             ,0x1ce);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate()
	{
		tcu::TestLog&		  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();

		// Compile & link the program to use
		de::SharedPtr<glu::ShaderProgram> program(
			new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vsh(), fsh())));
		log << (*program);
		if (!program->isOk())
		{
			TCU_FAIL("Program compilation failed");
		}
		m_program = program->getProgram();

		gl.useProgram(m_program);

		for (GLuint i = 0; i < NUM_TEXTURES; ++i)
		{
			GLchar samplerName[] = "texInput[0]";
			samplerName[9]		 = static_cast<GLchar>('0' + i);
			GLint loc			 = gl.getUniformLocation(m_program, samplerName);
			gl.uniform1i(loc, i);
		}

		for (int testPass = 0; testPass < numTestPasses(); ++testPass)
		{
			// Initialize texture data at the beginning of each test pass
			initTextureData();

			// Perform rendering passes
			for (int renderPass = 0; renderPass < numRenderPasses(); ++renderPass)
			{
				// Setup render pass
				setupRenderPass(testPass, renderPass);

				// Render a set of primitives that cover each pixel of the framebuffer exactly once
				render();

				// If a TextureBarrier is needed insert it here
				if (needsBarrier())
					gl.textureBarrier();
			}

			// Update reference data after actual rendering to avoid bubbles
			for (int renderPass = 0; renderPass < numRenderPasses(); ++renderPass)
			{
				// Setup render pass
				setupRenderPass(testPass, renderPass);

				// Update reference data
				updateTextureData();
			}

			// Verify results at the end of each test pass
			if (!verifyTextureData())
			{
				TCU_FAIL("Failed to validate rendering results");
			}
		}

		gl.useProgram(0);

		// Test case passed
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}